

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O2

int wally_tx_witness_stack_clone_alloc
              (wally_tx_witness_stack *stack,wally_tx_witness_stack **output)

{
  int iVar1;
  long lVar2;
  ulong index;
  wally_tx_witness_stack *result;
  
  iVar1 = -2;
  if ((output != (wally_tx_witness_stack **)0x0) &&
     (*output = (wally_tx_witness_stack *)0x0, stack != (wally_tx_witness_stack *)0x0)) {
    iVar1 = wally_tx_witness_stack_init_alloc(stack->items_allocation_len,&result);
    lVar2 = 8;
    index = 0;
    while (iVar1 == 0) {
      if (stack->num_items <= index) {
        *output = result;
        return 0;
      }
      iVar1 = wally_tx_witness_stack_set
                        (result,index,*(uchar **)((long)stack->items + lVar2 + -8),
                         *(size_t *)((long)&stack->items->witness + lVar2));
      index = index + 1;
      lVar2 = lVar2 + 0x10;
    }
    wally_tx_witness_stack_free(result);
  }
  return iVar1;
}

Assistant:

int wally_tx_witness_stack_clone_alloc(const struct wally_tx_witness_stack *stack,
                                       struct wally_tx_witness_stack **output)
{
    struct wally_tx_witness_stack *result;
    size_t i;
    int ret;

    TX_CHECK_OUTPUT;
    if (!stack)
        return WALLY_EINVAL;

    ret = wally_tx_witness_stack_init_alloc(stack->items_allocation_len, &result);
    for (i = 0; ret == WALLY_OK && i < stack->num_items; ++i) {
        ret = wally_tx_witness_stack_set(result, i,
                                         stack->items[i].witness,
                                         stack->items[i].witness_len);
    }
    if (ret == WALLY_OK)
        *output = result;
    else
        wally_tx_witness_stack_free(result);
    return ret;
}